

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O2

void __thiscall IMLE::set_internal_parameters(IMLE *this)

{
  int iVar1;
  double dVar2;
  Scalar SVar3;
  double dVar4;
  double local_40;
  double local_38;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_30;
  
  iVar1 = (int)(((long)(this->experts).
                       super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       .
                       super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->experts).
                      super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      .
                      super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x308);
  this->M = iVar1;
  if (iVar1 == 0) {
    local_30.m_rows.m_value = (long)this->d;
    local_30.m_functor.m_other = (this->param).sigma0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              (&this->Sigma,&local_30);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
              (&this->Psi,&(this->param).Psi0);
  }
  boost::math::
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::chi_squared_distribution
            ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)&local_30,(double)this->D);
  local_40 = 1.0 - (this->param).p0;
  dVar2 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                      *)&local_30,&local_40);
  dVar2 = exp(dVar2 * -0.5);
  this->sig_level_noiseX_rbf = dVar2;
  boost::math::
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::chi_squared_distribution
            ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)&local_30,(double)this->d);
  local_40 = 1.0 - (this->param).p0;
  dVar2 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                      *)&local_30,&local_40);
  dVar2 = exp(dVar2 * -0.5);
  this->sig_level_noiseZ_rbf = dVar2;
  boost::math::
  chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  ::chi_squared_distribution
            ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
              *)&local_30,(double)(this->d + this->D));
  local_40 = 1.0 - (this->param).p0;
  dVar2 = boost::math::
          quantile<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>
                    ((chi_squared_distribution<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                      *)&local_30,&local_40);
  dVar2 = exp(dVar2 * -0.5);
  this->sig_level_noiseZX_rbf = dVar2;
  dVar2 = this->sig_level_noiseX_rbf;
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Psi);
  if (SVar3 < 0.0) {
    dVar4 = sqrt(SVar3);
  }
  else {
    dVar4 = SQRT(SVar3);
  }
  this->pNoiseModelX = dVar2 / dVar4;
  dVar2 = this->sig_level_noiseZ_rbf;
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Sigma);
  if (SVar3 < 0.0) {
    dVar4 = sqrt(SVar3);
  }
  else {
    dVar4 = SQRT(SVar3);
  }
  this->pNoiseModelZ = dVar2 / dVar4;
  dVar2 = this->sig_level_noiseZX_rbf;
  local_38 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                       ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Psi);
  SVar3 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::prod
                    ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->Sigma);
  dVar4 = SVar3 * local_38;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  this->pNoiseModelZX = dVar2 / dVar4;
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::set_internal_parameters()
{
    // Number of experts
    M = experts.size();

    // Initial guess for hyperparameters
    if( M == 0 )
    {
        Sigma = Z::Constant(d,param.sigma0);  //Template: Z::Constant(param.sigma0)
        Psi = param.Psi0;
    }

    // Significance test level
    sig_level_noiseX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D), 1.0 - param.p0) );
    sig_level_noiseZ_rbf = exp(-0.5* quantile(boost::math::chi_squared(d), 1.0 - param.p0) );
    sig_level_noiseZX_rbf = exp(-0.5* quantile(boost::math::chi_squared(D+d), 1.0 - param.p0) );

    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf/ sqrt(Psi.prod() * Sigma.prod());
}